

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::ActivateTheme(Context *this,String *theme_name,bool activate)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  Element *this_00;
  ElementDocument *this_01;
  undefined7 in_register_00000011;
  ulong uVar4;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar5;
  
  if ((int)CONCAT71(in_register_00000011,activate) == 0) {
    sVar3 = itlib::
            flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::erase<std::__cxx11::string>
                      ((flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&this->active_themes,theme_name);
    uVar4 = (ulong)(sVar3 != 0);
  }
  else {
    pVar5 = itlib::
            flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(&this->active_themes,theme_name);
    uVar4 = pVar5._8_8_;
  }
  if ((uVar4 & 1) != 0) {
    iVar1 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,true);
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        this_00 = Element::GetChild((this->root)._M_t.
                                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                    .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,iVar1
                                   );
        this_01 = Element::GetOwnerDocument(this_00);
        if (this_01 != (ElementDocument *)0x0) {
          ElementDocument::DirtyMediaQueries(this_01);
        }
        iVar1 = iVar1 + 1;
        iVar2 = Element::GetNumChildren
                          ((this->root)._M_t.
                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,true);
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

void Context::ActivateTheme(const String& theme_name, bool activate)
{
	bool theme_changed = false;

	if (activate)
		theme_changed = active_themes.insert(theme_name).second;
	else
		theme_changed = (active_themes.erase(theme_name) > 0);

	if (theme_changed)
	{
		for (int i = 0; i < root->GetNumChildren(true); ++i)
		{
			if (ElementDocument* document = root->GetChild(i)->GetOwnerDocument())
				document->DirtyMediaQueries();
		}
	}
}